

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::edit(QAbstractItemView *this,QModelIndex *index)

{
  bool bVar1;
  byte bVar2;
  QAbstractItemViewPrivate *pQVar3;
  QModelIndex *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  int line;
  QAbstractItemViewPrivate *this_00;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar3 = d_func((QAbstractItemView *)0x802a2e);
  line = (int)((ulong)pQVar3 >> 0x20);
  bVar1 = QAbstractItemViewPrivate::isIndexValid(this_00,in_RSI);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    QMessageLogger::QMessageLogger((QMessageLogger *)this_00,(char *)in_RSI,line,(char *)in_RDI);
    QMessageLogger::warning(local_28,"edit: index was invalid");
  }
  bVar2 = (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                 super_QWidgetPrivate + 0x2e0))(in_RDI,in_RSI,0x1f,0);
  if (((bVar2 ^ 0xff) & 1) != 0) {
    QMessageLogger::QMessageLogger((QMessageLogger *)this_00,(char *)in_RSI,line,(char *)in_RDI);
    QMessageLogger::warning(local_48,"edit: editing failed");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::edit(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    if (Q_UNLIKELY(!d->isIndexValid(index)))
        qWarning("edit: index was invalid");
    if (Q_UNLIKELY(!edit(index, AllEditTriggers, nullptr)))
        qWarning("edit: editing failed");
}